

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

void __thiscall
bloaty::RangeSink::RangeSink
          (RangeSink *this,InputFile *file,Options *options,DataSource data_source,
          DualMap *translator,Arena *arena)

{
  this->file_ = file;
  Options::Options(&this->options_,options);
  this->data_source_ = data_source;
  this->translator_ = translator;
  (this->outputs_).
  super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->outputs_).
  super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->outputs_).
  super__Vector_base<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->arena_ = arena;
  return;
}

Assistant:

RangeSink::RangeSink(const InputFile* file, const Options& options,
                     DataSource data_source, const DualMap* translator,
                     google::protobuf::Arena* arena)
    : file_(file),
      options_(options),
      data_source_(data_source),
      translator_(translator),
      arena_(arena) {}